

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray *
xxflate(QByteArray *__return_storage_ptr__,ZLibOp op,QArrayDataPointer<char> *out,
       QByteArrayView input,function_ref<int_(z_stream_s_*)_const> init,
       function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk,
       function_ref<void_(z_stream_s_*)_const> deinit)

{
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  qsizetype local_108;
  z_stream_s local_f8;
  ulong local_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  function_ref<void_(z_stream_s_*)_const> *local_58;
  z_stream_s *pzStack_50;
  undefined8 local_48;
  long local_38;
  
  uVar8 = input.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (out->ptr == (char *)0x0) {
    local_f8.next_in._0_4_ = 2;
    local_f8.next_in._4_4_ = 0;
    local_f8.avail_in = 0;
    local_f8._12_4_ = 0;
    local_f8.total_in._0_4_ = 0;
    local_f8.total_in._4_4_ = 0;
    local_f8.next_out = "default";
    pcVar6 = "qCompress";
    if (op != Compression) {
      pcVar6 = "qUncompress";
    }
    QMessageLogger::warning((QMessageLogger *)&local_f8,"%s: %s",pcVar6,"Not enough memory");
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_0030624d;
  }
  if (out->d == (Data *)0x0) {
    local_108 = 0;
  }
  else {
    local_108 = (out->d->super_QArrayData).alloc;
  }
  local_f8.avail_in = 0;
  local_f8._12_4_ = 0;
  local_f8.adler = 0;
  local_f8.reserved = 0;
  local_f8.opaque = (voidpf)0x0;
  local_f8.data_type = 0;
  local_f8._92_4_ = 0;
  local_f8.zalloc = (alloc_func)0x0;
  local_f8.zfree = (free_func)0x0;
  local_f8.msg = (char *)0x0;
  local_f8.state = (internal_state *)0x0;
  local_f8._32_8_ = 0;
  local_f8.total_out = 0;
  local_f8.total_in._0_4_ = 0;
  local_f8.total_in._4_4_ = 0;
  local_f8.next_out = (Bytef *)0x0;
  local_f8.next_in._0_4_ = input.m_data._0_4_;
  local_f8.next_in._4_4_ = input.m_data._4_4_;
  local_78 = &local_f8;
  iVar4 = (*init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_thunk_ptr)
                    (init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.
                     m_bound_entity,(z_stream_s **)&local_78);
  if (iVar4 != 0) {
    unexpectedZlibError(__return_storage_ptr__,op,iVar4,local_f8.msg);
    goto LAB_0030624d;
  }
  local_58 = &deinit;
  local_48 = 0xaaaaaaaaaaaaaa01;
  pcVar6 = "qCompress";
  if (op != Compression) {
    pcVar6 = "qUncompress";
  }
  pzStack_50 = &local_f8;
  do {
    if (local_f8.avail_out == 0) {
      uVar5 = local_108 - out->size;
      if (uVar5 == 0) {
        QArrayDataPointer<char>::reallocateAndGrow(out,GrowsAtEnd,1,(QArrayDataPointer<char> *)0x0);
        if (out->ptr != (char *)0x0) {
          if (out->d == (Data *)0x0) {
            local_108 = 0;
          }
          else {
            local_108 = (out->d->super_QArrayData).alloc;
          }
          uVar5 = local_108 - out->size;
          goto LAB_003060a5;
        }
        local_78._0_4_ = 2;
        local_78._4_4_ = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        local_64 = 0;
        local_60 = "default";
        QMessageLogger::warning((QMessageLogger *)&local_78,"%s: %s",pcVar6);
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
        bVar3 = false;
      }
      else {
LAB_003060a5:
        local_f8.next_out = (Bytef *)(out->ptr + out->size);
        if (0xfffffffe < uVar5) {
          uVar5 = 0xffffffff;
        }
        local_f8.avail_out = (int)uVar5;
        out->size = out->size + uVar5;
        bVar3 = true;
      }
      if (!bVar3) goto LAB_00306234;
    }
    if (local_f8.avail_in == 0) {
      uVar5 = 0xffffffff;
      if (uVar8 < 0xffffffff) {
        uVar5 = uVar8;
      }
      local_f8.avail_in = (uInt)uVar5;
      uVar8 = uVar8 - uVar5;
    }
    local_80 = uVar8;
    local_78 = &local_f8;
    iVar4 = (*processChunk.
              super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
              m_thunk_ptr)(processChunk.
                           super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>
                           .m_bound_entity,(z_stream_s **)&local_78,&local_80);
  } while (iVar4 == 0);
  if (iVar4 == -4) {
    local_78._0_4_ = 2;
    local_78._4_4_ = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = "default";
    pcVar6 = "qCompress";
    if (op != Compression) {
      pcVar6 = "qUncompress";
    }
    QMessageLogger::warning((QMessageLogger *)&local_78,"%s: %s",pcVar6,"Not enough memory");
LAB_0030620d:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (iVar4 == -3) {
      local_78._0_4_ = 2;
      local_78._4_4_ = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      local_64 = 0;
      local_60 = "default";
      QMessageLogger::warning
                ((QMessageLogger *)&local_78,"%s: %s","qUncompress","Input data is corrupted");
      goto LAB_0030620d;
    }
    if (iVar4 == 1) {
      lVar7 = out->size - (local_f8._32_8_ & 0xffffffff);
      out->size = lVar7;
      out->ptr[lVar7] = '\0';
      pDVar2 = out->d;
      pcVar6 = out->ptr;
      out->d = (Data *)0x0;
      out->ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar6;
      qVar1 = out->size;
      out->size = 0;
      (__return_storage_ptr__->d).size = qVar1;
    }
    else {
      unexpectedZlibError(__return_storage_ptr__,op,iVar4,local_f8.msg);
    }
  }
LAB_00306234:
  local_78 = &local_f8;
  (*deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_thunk_ptr)
            (deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_bound_entity,
             (z_stream_s **)&local_78);
LAB_0030624d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray xxflate(ZLibOp op, QArrayDataPointer<char> out, QByteArrayView input,
                          qxp::function_ref<int(z_stream *) const> init,
                          qxp::function_ref<int(z_stream *, size_t) const> processChunk,
                          qxp::function_ref<void(z_stream *) const> deinit)
{
    if (out.data() == nullptr) // allocation failed
        return tooMuchData(op);
    qsizetype capacity = out.allocatedCapacity();

    const auto initalSize = out.size;

    z_stream zs = {};
    zs.next_in = reinterpret_cast<uchar *>(const_cast<char *>(input.data())); // 1980s C API...
    if (const int err = init(&zs); err != Z_OK)
        return unexpectedZlibError(op, err, zs.msg);
    const auto sg = qScopeGuard([&] { deinit(&zs); });

    using ZlibChunkSize_t = decltype(zs.avail_in);
    static_assert(!std::is_signed_v<ZlibChunkSize_t>);
    static_assert(std::is_same_v<ZlibChunkSize_t, decltype(zs.avail_out)>);
    constexpr auto MaxChunkSize = std::numeric_limits<ZlibChunkSize_t>::max();
    [[maybe_unused]]
    constexpr auto MaxStatisticsSize = std::numeric_limits<decltype(zs.total_out)>::max();

    size_t inputLeft = size_t(input.size());

    int res;
    do {
        Q_ASSERT(out.freeSpaceAtBegin() == 0); // ensure prepend optimization stays out of the way
        Q_ASSERT(capacity == out.allocatedCapacity());

        if (zs.avail_out == 0) {
            Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                     size_t(out.size) - initalSize == zs.total_out);
            Q_ASSERT(out.size <= capacity);

            qsizetype avail_out = capacity - out.size;
            if (avail_out == 0) {
                out->reallocateAndGrow(QArrayData::GrowsAtEnd, 1); // grow to next natural capacity
                if (out.data() == nullptr) // reallocation failed
                    return tooMuchData(op);
                capacity = out.allocatedCapacity();
                avail_out = capacity - out.size;
            }
            zs.next_out = reinterpret_cast<uchar *>(out.data()) + out.size;
            zs.avail_out = size_t(avail_out) > size_t(MaxChunkSize) ? MaxChunkSize
                                                                    : ZlibChunkSize_t(avail_out);
            out.size += zs.avail_out;

            Q_ASSERT(zs.avail_out > 0);
        }

        if (zs.avail_in == 0) {
            // zs.next_in is kept up-to-date by processChunk(), so nothing to do
            zs.avail_in = inputLeft > MaxChunkSize ? MaxChunkSize : ZlibChunkSize_t(inputLeft);
            inputLeft -= zs.avail_in;
        }

        res = processChunk(&zs, inputLeft);
    } while (res == Z_OK);

    switch (res) {
    case Z_STREAM_END:
        out.size -= zs.avail_out;
        Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                 size_t(out.size) - initalSize == zs.total_out);
        Q_ASSERT(out.size <= out.allocatedCapacity());
        out.data()[out.size] = '\0';
        return QByteArray(std::move(out));

    case Z_MEM_ERROR:
        return tooMuchData(op);

    case Z_BUF_ERROR:
        Q_UNREACHABLE(); // cannot happen - we supply a buffer that can hold the result,
                         // or else error out early

    case Z_DATA_ERROR:   // can only happen on decompression
        Q_ASSERT(op == ZLibOp::Decompression);
        return invalidCompressedData();

    default:
        return unexpectedZlibError(op, res, zs.msg);
    }
}